

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Buffer::Buffer(Buffer *this)

{
  list<int,_std::allocator<int>_> *this_00;
  list<int,_std::allocator<int>_> *this_01;
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  undefined8 uStack_28;
  
  this_00 = &this->Empty_Block;
  lVar2 = 0;
  uStack_28 = in_RAX;
  do {
    Block::Block((Block *)(this->buffer[0].data + lVar2 + -0x24));
    lVar2 = lVar2 + 0x2028;
  } while (lVar2 != 0x2832000);
  (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  this_01 = &this->Occupy_Block;
  (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  iVar1 = 0;
  while (uStack_28 = CONCAT44(iVar1,(undefined4)uStack_28), iVar1 < 0x1400) {
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              (this_00,(value_type_conflict1 *)((long)&uStack_28 + 4));
    this->Dirty[uStack_28._4_4_] = 0;
    this->Pin[uStack_28._4_4_] = 0;
    iVar1 = uStack_28._4_4_ + 1;
  }
  std::__cxx11::list<int,_std::allocator<int>_>::clear(this_01);
  return;
}

Assistant:

Buffer::Buffer(void){
	int i;
	for (i = 0; i < MAX_BLOCKS; i++) {
		this->Empty_Block.push_back(i);
		this->UnDirt(i);
		this->UnLock(i);
	}
	this->Occupy_Block.clear();
}